

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O1

time_point __thiscall absl::lts_20250127::ToChronoTime(lts_20250127 *this,Time t)

{
  time_point tVar1;
  Duration d;
  Duration d_00;
  Duration DVar2;
  Duration DStack_10;
  undefined4 uStack_4;
  
  DVar2.rep_lo_ = t.rep_.rep_hi_.lo_;
  if ((long)this < 0) {
    DStack_10.rep_hi_.lo_ = 0x2b51c9;
    DStack_10.rep_hi_.hi_ = 0;
    d_00.rep_lo_ = DVar2.rep_lo_;
    d_00.rep_hi_ = (HiRep)this;
    DVar2 = Floor(d_00,(Duration)(ZEXT412(4) << 0x40));
    d.rep_lo_ = DVar2.rep_lo_;
    d.rep_hi_.hi_ = 0;
    d.rep_hi_.lo_ = d.rep_lo_;
    tVar1.__d.__r =
         time_internal::ToChronoDuration<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                   ((time_internal *)DVar2.rep_hi_,d);
    return (time_point)tVar1.__d.__r;
  }
  if (DVar2.rep_lo_ != 0xffffffff) {
    if ((ulong)this >> 0x21 == 0) {
      return (time_point)((ulong)(DVar2.rep_lo_ >> 2) + (long)this * 1000000000);
    }
    stack0xfffffffffffffff8 = CONCAT44(uStack_4,DVar2.rep_lo_);
    DVar2.rep_hi_ = (HiRep)this;
    DStack_10.rep_hi_ = (HiRep)this;
    tVar1.__d.__r = (duration)IDivDuration(DVar2,(Duration)(ZEXT412(4) << 0x40),&DStack_10);
    return (time_point)tVar1.__d.__r;
  }
  tVar1.__d.__r = (duration)-0x8000000000000000;
  if (-1 < (long)this) {
    tVar1.__d.__r = (duration)0x7fffffffffffffff;
  }
  return (time_point)tVar1.__d.__r;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr bool operator<(Duration lhs,
                                                       Duration rhs) {
  return time_internal::GetRepHi(lhs) != time_internal::GetRepHi(rhs)
             ? time_internal::GetRepHi(lhs) < time_internal::GetRepHi(rhs)
         : time_internal::GetRepHi(lhs) == (std::numeric_limits<int64_t>::min)()
             ? time_internal::GetRepLo(lhs) + 1 <
                   time_internal::GetRepLo(rhs) + 1
             : time_internal::GetRepLo(lhs) < time_internal::GetRepLo(rhs);
}